

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe(char *source,char *dest,int compressedSize,int maxDecompressedSize)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  long lVar4;
  ushort uVar5;
  ushort uVar6;
  undefined4 uVar7;
  BYTE *s_2;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  size_t __n;
  ushort *puVar12;
  ushort *__src;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  ushort *puVar16;
  BYTE *d_1;
  char *pcVar17;
  bool bVar18;
  size_t dec64table [8];
  int local_98;
  long local_78 [9];
  
  local_78[2] = 0;
  local_78[4] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[3] = 0xffffffffffffffff;
  local_78[5] = 1;
  local_78[6] = 2;
  local_78[7] = 3;
  if (maxDecompressedSize != 0) {
    puVar16 = (ushort *)(source + compressedSize);
    pcVar2 = dest + maxDecompressedSize;
    pcVar1 = pcVar2 + -8;
    puVar12 = (ushort *)source;
    pcVar14 = dest;
switchD_00154bfe_caseD_0:
    uVar5 = *puVar12;
    __src = (ushort *)((long)puVar12 + 1);
    uVar11 = (uint)(byte)((byte)uVar5 >> 4);
    __n = (size_t)uVar11;
    if (uVar11 == 0xf) {
      __n = 0xf;
      do {
        uVar6 = *__src;
        __src = (ushort *)((long)__src + 1);
        __n = __n + (byte)uVar6;
        if ((ushort *)((long)puVar16 - 0xfU) <= __src) break;
      } while ((byte)uVar6 == 0xff);
      if (-1 < (long)__n) goto LAB_00154ad7;
LAB_00154b95:
      puVar12 = __src;
      pcVar17 = pcVar14;
      uVar7 = 6;
    }
    else {
LAB_00154ad7:
      pcVar17 = pcVar14 + __n;
      puVar12 = (ushort *)((long)__src + __n);
      if ((dest + (long)maxDecompressedSize + -0xc < pcVar17) || (puVar16 + -4 < puVar12)) {
        if ((puVar12 != puVar16) || (pcVar2 < pcVar17)) goto LAB_00154b95;
        memcpy(pcVar14,__src,__n);
        uVar7 = 3;
      }
      else {
        do {
          *(undefined8 *)pcVar14 = *(undefined8 *)__src;
          pcVar14 = pcVar14 + 8;
          __src = __src + 4;
        } while (pcVar14 < pcVar17);
        pcVar14 = pcVar17 + -(ulong)*puVar12;
        puVar12 = puVar12 + 1;
        uVar7 = 6;
        if (dest <= pcVar14) {
          uVar9 = (ulong)((byte)uVar5 & 0xf);
          if (uVar9 == 0xf) {
            uVar9 = 0xf;
            do {
              if ((ushort *)((long)puVar16 - 5U) < puVar12) {
                bVar18 = false;
                uVar7 = 6;
                goto LAB_00154ba1;
              }
              uVar5 = *puVar12;
              puVar12 = (ushort *)((long)puVar12 + 1);
              uVar9 = uVar9 + (byte)uVar5;
            } while ((ulong)(byte)uVar5 == 0xff);
            bVar18 = -1 < (long)uVar9;
            uVar7 = 6;
            if (bVar18) {
              uVar7 = 0;
            }
LAB_00154ba1:
            if (!bVar18) goto LAB_00154bec;
          }
          lVar15 = (long)pcVar17 - (long)pcVar14;
          if (lVar15 < 8) {
            lVar4 = *(long *)(&DAT_0015b250 + lVar15 * 8);
            pcVar13 = pcVar14 + (lVar4 - local_78[lVar15]);
            *pcVar17 = *pcVar14;
            pcVar17[1] = pcVar14[1];
            pcVar17[2] = pcVar14[2];
            pcVar17[3] = pcVar14[3];
            *(undefined4 *)(pcVar17 + 4) = *(undefined4 *)(pcVar14 + lVar4);
          }
          else {
            *(undefined8 *)pcVar17 = *(undefined8 *)pcVar14;
            pcVar13 = pcVar14 + 8;
          }
          pcVar14 = pcVar17 + uVar9 + 4;
          pcVar17 = pcVar17 + 8;
          if (dest + (long)maxDecompressedSize + -0xc < pcVar14) {
            uVar7 = 6;
            if (pcVar14 <= pcVar2 + -5) {
              pcVar8 = pcVar13;
              pcVar10 = pcVar17;
              if (pcVar17 < pcVar1) {
                do {
                  *(undefined8 *)pcVar10 = *(undefined8 *)pcVar8;
                  pcVar10 = pcVar10 + 8;
                  pcVar8 = pcVar8 + 8;
                } while (pcVar10 < pcVar1);
                pcVar13 = pcVar13 + ((long)pcVar1 - (long)pcVar17);
                pcVar10 = pcVar1;
              }
              for (; pcVar17 = pcVar14, uVar7 = 0, pcVar10 < pcVar14; pcVar10 = pcVar10 + 1) {
                cVar3 = *pcVar13;
                pcVar13 = pcVar13 + 1;
                *pcVar10 = cVar3;
              }
            }
          }
          else {
            do {
              *(undefined8 *)pcVar17 = *(undefined8 *)pcVar13;
              pcVar17 = pcVar17 + 8;
              pcVar13 = pcVar13 + 8;
            } while (pcVar17 < pcVar14);
            pcVar17 = pcVar14;
            uVar7 = 0;
          }
        }
      }
    }
LAB_00154bec:
    pcVar14 = pcVar17;
    switch(uVar7) {
    case 0:
    case 2:
      goto switchD_00154bfe_caseD_0;
    default:
      goto switchD_00154bfe_caseD_1;
    case 3:
      pcVar17 = (char *)(ulong)(uint)((int)pcVar17 - (int)dest);
      goto LAB_00154cb4;
    case 6:
      local_98 = (int)source;
      pcVar17 = (char *)(ulong)(~(uint)puVar12 + local_98);
      goto LAB_00154cb4;
    }
  }
  pcVar17 = (char *)0xffffffff;
  if (compressedSize == 1) {
    pcVar17 = (char *)(ulong)-(uint)(*source != '\0');
  }
LAB_00154cb4:
  return (int)pcVar17;
switchD_00154bfe_caseD_1:
  goto LAB_00154cb4;
}

Assistant:

int LZ4_decompress_safe(const char* source, char* dest, int compressedSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize, endOnInputSize, full, 0, noDict, (BYTE*)dest, NULL, 0);
}